

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O2

void crypto::iterated_hash<crypto::sha256_transform>::prepare_state
               (char *data,size_t count,hash_word *state)

{
  sha256_transform::init((EVP_PKEY_CTX *)state);
  hash(state,data,count << 6);
  return;
}

Assistant:

static void prepare_state(const char * data, size_t count, state_t state) {
		transform::init(state);
		hash(state, data, count * block_size);
	}